

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.cpp
# Opt level: O2

Token * __thiscall EOPlus::Lexer::ReadOperator(Token *__return_storage_ptr__,Lexer *this)

{
  bool bVar1;
  string *this_00;
  char a;
  char b;
  char cc;
  char c;
  Token *local_178;
  code *local_170 [2];
  code *local_160;
  code *local_158;
  code *local_150 [2];
  code *local_140;
  code *local_138;
  undefined1 local_130 [64];
  undefined1 local_f0 [64];
  undefined1 local_b0 [64];
  undefined1 local_70 [64];
  
  local_150[1] = (code *)0x0;
  c = '\0';
  cc = '\0';
  local_150[0] = ctype_op;
  local_138 = std::_Function_handler<bool_(char),_bool_(*)(char)>::_M_invoke;
  local_140 = std::_Function_handler<bool_(char),_bool_(*)(char)>::_M_manager;
  bVar1 = GetCharIf(this,&c,(function<bool_(char)> *)local_150);
  std::_Function_base::~_Function_base((_Function_base *)local_150);
  if (bVar1) {
    local_178 = __return_storage_ptr__;
    PeekChar(this,&cc);
    a = c;
    b = cc;
    bVar1 = check_op(c,cc);
    if (bVar1) {
      local_170[1] = (code *)0x0;
      local_170[0] = ctype_op;
      local_158 = std::_Function_handler<bool_(char),_bool_(*)(char)>::_M_invoke;
      local_160 = std::_Function_handler<bool_(char),_bool_(*)(char)>::_M_manager;
      GetCharIf(this,&cc,(function<bool_(char)> *)local_170);
      std::_Function_base::~_Function_base((_Function_base *)local_170);
      a = c;
      b = cc;
    }
    bVar1 = check_op(a,b);
    if (bVar1) {
      util::variant::variant((variant *)local_b0,(uint)(byte)((a + b * '\x04') - 0x20));
      __return_storage_ptr__ = local_178;
      Token::Token(local_178,Operator,(variant *)local_b0);
      this_00 = (string *)(local_b0 + 0x10);
    }
    else {
      bVar1 = check_op(a,'\0');
      if (bVar1) {
        util::variant::variant((variant *)local_f0,(uint)(byte)(a - 0x20));
        __return_storage_ptr__ = local_178;
        Token::Token(local_178,Operator,(variant *)local_f0);
        this_00 = (string *)(local_f0 + 0x10);
      }
      else {
        util::variant::variant((variant *)local_130);
        __return_storage_ptr__ = local_178;
        Token::Token(local_178,Invalid,(variant *)local_130);
        this_00 = (string *)(local_130 + 0x10);
      }
    }
  }
  else {
    util::variant::variant((variant *)local_70);
    Token::Token(__return_storage_ptr__,Invalid,(variant *)local_70);
    this_00 = (string *)(local_70 + 0x10);
  }
  std::__cxx11::string::~string(this_00);
  return __return_storage_ptr__;
}

Assistant:

Token Lexer::ReadOperator()
	{
		char c = '\0';
		char cc = '\0';

		if (!this->GetCharIf(c, ctype_op))
			return Token();

		this->PeekChar(cc);

		if (check_op(c, cc))
			this->GetCharIf(cc, ctype_op);

		if (check_op(c, cc))
			return Token(Token::Operator, UOP2(c, cc));
		else if (check_op(c, '\0'))
			return Token(Token::Operator, UOP2(c, '\0'));
		else
			return Token();
	}